

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

ostream * despot::operator<<(ostream *os,State *state)

{
  ostream *poVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(state_id = ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(os,state->state_id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", weight = ",0xb);
  poVar1 = std::ostream::_M_insert<double>(state->weight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", text = ",9);
  (*state->_vptr_State[2])(&local_40,state);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const State& state) {
	os << "(state_id = " << state.state_id << ", weight = " << state.weight
			<< ", text = " << (&state)->text() << ")";
	return os;
}